

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_parameter.hpp
# Opt level: O2

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,
                mrg_parameter<int,_2,_trng::mrg2> *P)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  mrg_parameter<int,_2,_trng::mrg2> P_new;
  delim_c local_33;
  delim_c local_32;
  delim_c local_31;
  mrg_parameter<int,_2,_trng::mrg2> local_30;
  
  local_30.a[0] = 0;
  local_30.a[1] = 0;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_31.c = '(';
  utility::operator>>(in,&local_31);
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 4) {
    std::wistream::operator>>((wistream *)in,(int *)((long)local_30.a + lVar3));
    if (lVar3 == 0) {
      local_33.c = ' ';
      utility::operator>>(in,&local_33);
    }
  }
  local_32.c = ')';
  utility::operator>>(in,&local_32);
  lVar3 = *(long *)in;
  lVar2 = *(long *)(lVar3 + -0x18);
  if (((byte)in[lVar2 + 0x20] & 5) == 0) {
    *(mrg_parameter<int,_2,_trng::mrg2> *)P->a = local_30;
    lVar2 = *(long *)(lVar3 + -0x18);
  }
  *(undefined4 *)(in + lVar2 + 0x18) = uVar1;
  return in;
}

Assistant:

mrg_parameter() = default;